

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsTextItem::QGraphicsTextItem(QGraphicsTextItem *this,QGraphicsItem *parent)

{
  QGraphicsItemPrivate *this_00;
  undefined8 *puVar1;
  
  this_00 = (QGraphicsItemPrivate *)operator_new(0x178);
  QGraphicsItemPrivate::QGraphicsItemPrivate(this_00);
  QGraphicsObject::QGraphicsObject((QGraphicsObject *)this,this_00,parent);
  *(undefined ***)this = &PTR_metaObject_007ebfa8;
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsTextItem_007ec100;
  puVar1 = (undefined8 *)operator_new(0x38);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *(undefined8 *)((long)puVar1 + 0x1f) = 0;
  *(undefined8 *)((long)puVar1 + 0x27) = 0;
  *(undefined8 **)(this + 0x20) = puVar1;
  puVar1[6] = this;
  *(ulong *)(*(long *)(this + 0x18) + 0x160) = *(ulong *)(*(long *)(this + 0x18) + 0x160) | 0x800;
  QGraphicsItem::setAcceptHoverEvents((QGraphicsItem *)(this + 0x10),true);
  QGraphicsItem::setFlag((QGraphicsItem *)(this + 0x10),ItemUsesExtendedStyleOption,true);
  return;
}

Assistant:

QGraphicsTextItem::QGraphicsTextItem(QGraphicsItem *parent)
    : QGraphicsObject(*new QGraphicsItemPrivate, parent),
      dd(new QGraphicsTextItemPrivate)
{
    dd->qq = this;
    setAcceptDrops(true);
    setAcceptHoverEvents(true);
    setFlag(ItemUsesExtendedStyleOption);
}